

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

bool leveldb::GetVarint64(Slice *input,uint64_t *value)

{
  char *pcVar1;
  char *limit;
  
  limit = input->data_ + input->size_;
  pcVar1 = GetVarint64Ptr(input->data_,limit,value);
  if (pcVar1 != (char *)0x0) {
    input->data_ = pcVar1;
    input->size_ = (long)limit - (long)pcVar1;
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool GetVarint64(Slice* input, uint64_t* value) {
  const char* p = input->data();
  const char* limit = p + input->size();
  const char* q = GetVarint64Ptr(p, limit, value);
  if (q == nullptr) {
    return false;
  } else {
    *input = Slice(q, limit - q);
    return true;
  }
}